

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  int iVar1;
  Index *pIStack_28;
  int iDb;
  Index *pIndex;
  char *zColl_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pIStack_28 = pTab->pIndex;
  do {
    if (pIStack_28 == (Index *)0x0) {
      return;
    }
    if (zColl == (char *)0x0) {
LAB_001b1000:
      iVar1 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
      sqlite3BeginWriteOperation(pParse,0,iVar1);
      sqlite3RefillIndex(pParse,pIStack_28,-1);
    }
    else {
      iVar1 = collationMatch(zColl,pIStack_28);
      if (iVar1 != 0) goto LAB_001b1000;
    }
    pIStack_28 = pIStack_28->pNext;
  } while( true );
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  Index *pIndex;              /* An index associated with pTab */

  for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
    if( zColl==0 || collationMatch(zColl, pIndex) ){
      int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
      sqlite3BeginWriteOperation(pParse, 0, iDb);
      sqlite3RefillIndex(pParse, pIndex, -1);
    }
  }
}